

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O0

xor_hashes_t * xor16_get_h0_h1_h2(uint64_t k,xor16_t *filter)

{
  uint32_t uVar1;
  uint64_t n;
  uint64_t uVar2;
  uint64_t uVar3;
  long in_RDX;
  xor_hashes_t *in_RDI;
  uint32_t r2;
  uint32_t r1;
  uint32_t r0;
  uint64_t hash;
  xor_hashes_t *pxVar4;
  
  pxVar4 = in_RDI;
  n = xor_mix_split((uint64_t)in_RDI,(uint64_t)in_RDI);
  in_RDI->h = n;
  uVar2 = xor_rotl64(n,0x15);
  uVar3 = xor_rotl64(n,0x2a);
  uVar1 = xor_reduce((uint32_t)n,(uint32_t)*(undefined8 *)(in_RDX + 8));
  in_RDI->h0 = uVar1;
  uVar1 = xor_reduce((uint32_t)uVar2,(uint32_t)*(undefined8 *)(in_RDX + 8));
  in_RDI->h1 = uVar1;
  uVar1 = xor_reduce((uint32_t)uVar3,(uint32_t)*(undefined8 *)(in_RDX + 8));
  in_RDI->h2 = uVar1;
  return pxVar4;
}

Assistant:

static inline xor_hashes_t xor16_get_h0_h1_h2(uint64_t k,
                                              const xor16_t *filter) {
  uint64_t hash = xor_mix_split(k, filter->seed);
  xor_hashes_t answer;
  answer.h = hash;
  uint32_t r0 = (uint32_t)hash;
  uint32_t r1 = (uint32_t)xor_rotl64(hash, 21);
  uint32_t r2 = (uint32_t)xor_rotl64(hash, 42);

  answer.h0 = xor_reduce(r0, (uint32_t)filter->blockLength);
  answer.h1 = xor_reduce(r1, (uint32_t)filter->blockLength);
  answer.h2 = xor_reduce(r2, (uint32_t)filter->blockLength);
  return answer;
}